

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               (HistogramBinState<duckdb::string_t> *source,
               HistogramBinState<duckdb::string_t> *target,AggregateInputData *input_data)

{
  bool bVar1;
  void *pvVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  vector<unsigned_long,_false> *pvVar6;
  reference pvVar7;
  long *in_RSI;
  long *in_RDI;
  idx_t bin_idx;
  string *in_stack_ffffffffffffff38;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *in_stack_ffffffffffffff40;
  vector<unsigned_long,_false> *this;
  vector<unsigned_long,_false> *local_80;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [40];
  long *local_10;
  long *local_8;
  
  if (*in_RDI != 0) {
    local_10 = in_RSI;
    if (*in_RSI == 0) {
      pvVar2 = operator_new(0x18);
      memset(pvVar2,0,0x18);
      vector<duckdb::string_t,_false>::vector((vector<duckdb::string_t,_false> *)0x1e73c0c);
      *local_10 = (long)pvVar2;
      pvVar2 = operator_new(0x18);
      memset(pvVar2,0,0x18);
      vector<unsigned_long,_false>::vector((vector<unsigned_long,_false> *)0x1e73c44);
      local_10[1] = (long)pvVar2;
      vector<duckdb::string_t,_false>::operator=
                ((vector<duckdb::string_t,_false> *)in_stack_ffffffffffffff40,
                 (vector<duckdb::string_t,_false> *)in_stack_ffffffffffffff38);
      vector<unsigned_long,_false>::operator=
                ((vector<unsigned_long,_false> *)in_stack_ffffffffffffff40,
                 (vector<unsigned_long,_false> *)in_stack_ffffffffffffff38);
    }
    else {
      local_8 = in_RDI;
      bVar1 = ::std::operator!=(in_stack_ffffffffffffff40,
                                (vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)
                                in_stack_ffffffffffffff38);
      if (bVar1) {
        local_4d = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_38,
                   "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
                   ,&local_39);
        NotImplementedException::NotImplementedException
                  ((NotImplementedException *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        local_4d = 0;
        __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      sVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10[1]);
      sVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8[1]);
      if (sVar3 != sVar4) {
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_70,
                   "Histogram combine - bin boundaries are the same but counts are different",
                   &local_71);
        InternalException::InternalException
                  ((InternalException *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_80 = (vector<unsigned_long,_false> *)0x0;
      while (this = local_80,
            pvVar6 = (vector<unsigned_long,_false> *)
                     ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10[1]
                               ), this < pvVar6) {
        pvVar7 = vector<unsigned_long,_false>::operator[](this,(size_type)in_stack_ffffffffffffff38)
        ;
        in_stack_ffffffffffffff38 = (string *)*pvVar7;
        pvVar7 = vector<unsigned_long,_false>::operator[](this,(size_type)in_stack_ffffffffffffff38)
        ;
        *pvVar7 = (long)&(((_Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)
                          &in_stack_ffffffffffffff38->_M_dataplus)->_M_impl).super__Vector_impl_data
                         ._M_start + *pvVar7;
        local_80 = (vector<unsigned_long,_false> *)
                   ((long)&(local_80->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}